

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

string * __thiscall
Json::Value::getComment_abi_cxx11_
          (string *__return_storage_ptr__,Value *this,CommentPlacement placement)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_a;
  allocator local_9;
  
  if ((this->comments_ == (CommentInfo *)0x0) ||
     (pcVar2 = this->comments_[placement].comment_, pcVar2 == (char *)0x0)) {
    pcVar2 = "";
    paVar1 = &local_a;
  }
  else {
    paVar1 = &local_9;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Value::getComment(CommentPlacement placement) const {
  if (hasComment(placement))
    return comments_[placement].comment_;
  return "";
}